

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec10.c
# Opt level: O0

void If_Dec10SwapAdjacent(word *pOut,word *pIn,int iVar,int nVars)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int Step;
  int Shift;
  int nWords;
  int k;
  int i;
  int nVars_local;
  int iVar_local;
  word *pIn_local;
  word *pOut_local;
  
  iVar1 = If_Dec10WordNum(nVars);
  if (nVars + -1 <= iVar) {
    __assert_fail("iVar < nVars - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec10.c"
                  ,0xcc,"void If_Dec10SwapAdjacent(word *, word *, int, int)");
  }
  if (iVar < 5) {
    for (nWords = 0; nWords < iVar1; nWords = nWords + 1) {
      bVar3 = (byte)(1 << ((byte)iVar & 0x1f));
      pOut[nWords] = pIn[nWords] & PMasks[iVar][0] |
                     (pIn[nWords] & PMasks[iVar][1]) << (bVar3 & 0x3f) |
                     (pIn[nWords] & PMasks[iVar][2]) >> (bVar3 & 0x3f);
    }
  }
  else if (iVar < 6) {
    for (nWords = 0; nWords < iVar1; nWords = nWords + 2) {
      pOut[nWords] = pIn[nWords] & 0xffffffff | pIn[nWords + 1] << 0x20;
      pOut[nWords + 1] = pIn[nWords + 1] & 0xffffffff00000000 | pIn[nWords] >> 0x20;
    }
  }
  else {
    iVar2 = 1 << ((byte)iVar - 6 & 0x1f);
    _nVars_local = pIn;
    pIn_local = pOut;
    for (Shift = 0; Shift < iVar1; Shift = iVar2 * 4 + Shift) {
      for (nWords = 0; nWords < iVar2; nWords = nWords + 1) {
        pIn_local[nWords] = _nVars_local[nWords];
      }
      for (nWords = 0; nWords < iVar2; nWords = nWords + 1) {
        pIn_local[iVar2 + nWords] = _nVars_local[iVar2 * 2 + nWords];
      }
      for (nWords = 0; nWords < iVar2; nWords = nWords + 1) {
        pIn_local[iVar2 * 2 + nWords] = _nVars_local[iVar2 + nWords];
      }
      for (nWords = 0; nWords < iVar2; nWords = nWords + 1) {
        pIn_local[iVar2 * 3 + nWords] = _nVars_local[iVar2 * 3 + nWords];
      }
      _nVars_local = _nVars_local + (iVar2 << 2);
      pIn_local = pIn_local + (iVar2 << 2);
    }
  }
  return;
}

Assistant:

static inline void If_Dec10SwapAdjacent( word * pOut, word * pIn, int iVar, int nVars )
{
    int i, k, nWords = If_Dec10WordNum( nVars );
    assert( iVar < nVars - 1 );
    if ( iVar < 5 )
    {
        int Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & PMasks[iVar][0]) | ((pIn[i] & PMasks[iVar][1]) << Shift) | ((pIn[i] & PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar > 5 )
    {
        int Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 4*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pIn[i];
            for ( i = 0; i < Step; i++ )
                pOut[Step+i] = pIn[2*Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[2*Step+i] = pIn[Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[3*Step+i] = pIn[3*Step+i];
            pIn  += 4*Step;
            pOut += 4*Step;
        }
    }
    else // if ( iVar == 5 )
    {
        for ( i = 0; i < nWords; i += 2 )
        {
            pOut[i]   = (pIn[i]   & ABC_CONST(0x00000000FFFFFFFF)) | ((pIn[i+1] & ABC_CONST(0x00000000FFFFFFFF)) << 32);
            pOut[i+1] = (pIn[i+1] & ABC_CONST(0xFFFFFFFF00000000)) | ((pIn[i]   & ABC_CONST(0xFFFFFFFF00000000)) >> 32);
        }
    }
}